

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O1

void __thiscall
Diligent::
DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
::DeviceObjectBase(DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                   *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
                  PipelineStateDesc *ObjDesc,bool bIsDeviceInternal)

{
  atomic<int> *paVar1;
  RenderDeviceVkImpl *pRVar2;
  Uint64 UVar3;
  ShaderResourceVariableDesc *pSVar4;
  ImmutableSamplerDesc *pIVar5;
  PIPELINE_TYPE PVar6;
  undefined3 uVar7;
  Uint32 UVar8;
  SHADER_RESOURCE_VARIABLE_TYPE SVar9;
  undefined3 uVar10;
  SHADER_TYPE SVar11;
  Uint32 UVar12;
  undefined4 uVar13;
  Uint32 UVar14;
  undefined4 uVar15;
  int iVar16;
  size_t sVar17;
  IMemoryAllocator *pIVar18;
  char *pcVar19;
  undefined4 extraout_var_00;
  PipelineStateDesc *Args_1;
  string msg;
  string local_48;
  undefined4 extraout_var;
  
  Args_1 = ObjDesc;
  RefCountedObject<Diligent::IPipelineStateVk>::RefCountedObject<>
            ((RefCountedObject<Diligent::IPipelineStateVk> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::IPipelineStateVk>).
  super_RefCountedObject<Diligent::IPipelineStateVk>.super_IPipelineStateVk.super_IPipelineState.
  super_IDeviceObject.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00afe958;
  this->m_pDevice = pDevice;
  PVar6 = ObjDesc->PipelineType;
  uVar7 = *(undefined3 *)&ObjDesc->field_0x9;
  UVar8 = ObjDesc->SRBAllocationGranularity;
  UVar3 = ObjDesc->ImmediateContextMask;
  SVar9 = (ObjDesc->ResourceLayout).DefaultVariableType;
  uVar10 = *(undefined3 *)&(ObjDesc->ResourceLayout).field_0x1;
  SVar11 = (ObjDesc->ResourceLayout).DefaultVariableMergeStages;
  UVar12 = (ObjDesc->ResourceLayout).NumVariables;
  uVar13 = *(undefined4 *)&(ObjDesc->ResourceLayout).field_0xc;
  pSVar4 = (ObjDesc->ResourceLayout).Variables;
  UVar14 = (ObjDesc->ResourceLayout).NumImmutableSamplers;
  uVar15 = *(undefined4 *)&(ObjDesc->ResourceLayout).field_0x1c;
  pIVar5 = (ObjDesc->ResourceLayout).ImmutableSamplers;
  (this->m_Desc).super_DeviceObjectAttribs.Name = (ObjDesc->super_DeviceObjectAttribs).Name;
  (this->m_Desc).PipelineType = PVar6;
  *(undefined3 *)&(this->m_Desc).field_0x9 = uVar7;
  (this->m_Desc).SRBAllocationGranularity = UVar8;
  (this->m_Desc).ImmediateContextMask = UVar3;
  (this->m_Desc).ResourceLayout.DefaultVariableType = SVar9;
  *(undefined3 *)&(this->m_Desc).ResourceLayout.field_0x1 = uVar10;
  (this->m_Desc).ResourceLayout.DefaultVariableMergeStages = SVar11;
  (this->m_Desc).ResourceLayout.NumVariables = UVar12;
  *(undefined4 *)&(this->m_Desc).ResourceLayout.field_0xc = uVar13;
  (this->m_Desc).ResourceLayout.Variables = pSVar4;
  (this->m_Desc).ResourceLayout.NumImmutableSamplers = UVar14;
  *(undefined4 *)&(this->m_Desc).ResourceLayout.field_0x1c = uVar15;
  (this->m_Desc).ResourceLayout.ImmutableSamplers = pIVar5;
  if (pDevice == (RenderDeviceVkImpl *)0x0) {
    iVar16 = 0;
  }
  else {
    LOCK();
    paVar1 = &(pDevice->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_UniqueId;
    iVar16 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    iVar16 = iVar16 + 1;
  }
  this->m_UniqueID = iVar16;
  this->m_bIsDeviceInternal = bIsDeviceInternal;
  (this->m_pUserData).m_pObject = (IObject *)0x0;
  if (!bIsDeviceInternal) {
    if (this->m_pDevice == (RenderDeviceVkImpl *)0x0) {
      FormatString<char[26],char[21]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pDevice != nullptr",(char (*) [21])Args_1);
      Args_1 = (PipelineStateDesc *)0x47;
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"DeviceObjectBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                 ,0x47);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    pRVar2 = this->m_pDevice;
    if ((pRVar2->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
        super_ObjectBase<Diligent::IRenderDeviceVk>.
        super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters == (RefCountersImpl *)0x0)
    {
      FormatString<char[26],char[26]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",(char (*) [26])Args_1);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"AddRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    RefCountersImpl::AddStrongRef
              ((pRVar2->
               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
               ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
               super_ObjectBase<Diligent::IRenderDeviceVk>.
               super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters);
  }
  pcVar19 = (ObjDesc->super_DeviceObjectAttribs).Name;
  if (pcVar19 == (char *)0x0) {
    pIVar18 = GetStringAllocator();
    iVar16 = (**pIVar18->_vptr_IMemoryAllocator)
                       (pIVar18,0x13,"Object address string",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x55);
    pcVar19 = (char *)CONCAT44(extraout_var_00,iVar16);
    snprintf(pcVar19,0x13,"0x%llX",this);
  }
  else {
    sVar17 = strlen(pcVar19);
    pIVar18 = GetStringAllocator();
    iVar16 = (**pIVar18->_vptr_IMemoryAllocator)
                       (pIVar18,sVar17 + 1,"Object name copy",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x4e);
    pcVar19 = (char *)CONCAT44(extraout_var,iVar16);
    memcpy(pcVar19,(ObjDesc->super_DeviceObjectAttribs).Name,sVar17 + 1);
  }
  (this->m_Desc).super_DeviceObjectAttribs.Name = pcVar19;
  return;
}

Assistant:

DeviceObjectBase(IReferenceCounters*   pRefCounters,
                     RenderDeviceImplType* pDevice,
                     const ObjectDescType& ObjDesc,
                     bool                  bIsDeviceInternal = false) :
        // clang-format off
        TBase              {pRefCounters},
        m_pDevice          {pDevice          },
        m_Desc             {ObjDesc          },
        m_UniqueID         {pDevice != nullptr ? pDevice->GenerateUniqueId() : 0},
        m_bIsDeviceInternal{bIsDeviceInternal}
    //clang-format on
    {
        // Do not keep strong reference to the device if the object is an internal device object
        if (!m_bIsDeviceInternal)
        {
            // Device can be null if object is used for serialization
            VERIFY_EXPR(m_pDevice != nullptr);
            m_pDevice->AddRef();
        }

        if (ObjDesc.Name != nullptr)
        {
            size_t  size     = strlen(ObjDesc.Name) + 1;
            char* NameCopy = ALLOCATE(GetStringAllocator(), "Object name copy", char, size);
            memcpy(NameCopy, ObjDesc.Name, size);
            m_Desc.Name = NameCopy;
        }
        else
        {
            size_t size       = 16 + 2 + 1; // 0x12345678
            char*  AddressStr = ALLOCATE(GetStringAllocator(), "Object address string", char, size);
            snprintf(AddressStr, size, "0x%llX", static_cast<unsigned long long>(reinterpret_cast<size_t>(this)));
            m_Desc.Name = AddressStr;
        }

        //                        !!!WARNING!!!
        // We cannot add resource to the hash table from here, because the object
        // has not been completely created yet and the reference counters object
        // is not initialized!
        //m_pDevice->AddResourceToHash( this ); - ERROR!
    }